

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::SetArgcArgv
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ostream *poVar1;
  uint uVar2;
  ostringstream tmpStream;
  ostringstream strStream;
  allocator<char> local_341;
  string local_340;
  string local_320 [11];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_320,"CMAKE_ARGC",&local_341);
  std::__cxx11::stringbuf::str();
  AddDefinition(this,local_320,local_340._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)local_320);
  for (uVar2 = 0;
      (ulong)uVar2 <
      (ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    poVar1 = std::operator<<((ostream *)local_320,"CMAKE_ARGV");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__cxx11::stringbuf::str();
    AddDefinition(this,&local_340,
                  (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar2]._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void cmMakefile::SetArgcArgv(const std::vector<std::string>& args)
{
  std::ostringstream strStream;
  strStream << args.size();
  this->AddDefinition("CMAKE_ARGC", strStream.str().c_str());
  // this->MarkVariableAsUsed("CMAKE_ARGC");

  for (unsigned int t = 0; t < args.size(); ++t) {
    std::ostringstream tmpStream;
    tmpStream << "CMAKE_ARGV" << t;
    this->AddDefinition(tmpStream.str(), args[t].c_str());
    // this->MarkVariableAsUsed(tmpStream.str().c_str());
  }
}